

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

bool __thiscall
Lib::Map<unsigned_int,_unsigned_int,_Lib::DefaultHash>::Iterator::hasNext(Iterator *this)

{
  bool bVar1;
  long *in_RDI;
  
  while( true ) {
    if (*in_RDI == in_RDI[1]) {
      return false;
    }
    bVar1 = Map<unsigned_int,_unsigned_int,_Lib::DefaultHash>::Entry::occupied((Entry *)*in_RDI);
    if (bVar1) break;
    *in_RDI = *in_RDI + 0xc;
  }
  return true;
}

Assistant:

bool hasNext()
    {
      while (_next != _last) {
        if (_next->occupied()) {
          return true;
        }
        _next++;
      }
      return false;
    }